

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parents.h
# Opt level: O0

void __thiscall wasm::Parents::Inner::Inner(Inner *this)

{
  Inner *this_local;
  
  ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  ::ExpressionStackWalker
            (&this->
              super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
            );
  std::
  map<wasm::Expression_*,_wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
  ::map(&this->parentMap);
  return;
}

Assistant:

void visitExpression(Expression* curr) { parentMap[curr] = getParent(); }